

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf,bool sparse)

{
  TwoStageDynamicBayesianNetwork *this_00;
  undefined1 auVar1 [16];
  pointer pSVar2;
  void *pvVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Index IVar9;
  Index IVar10;
  ostream *poVar11;
  ulong uVar12;
  pointer puVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  ObservationModelMappingSparse *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  size_type sVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  E *this_02;
  uint *puVar20;
  int nrS;
  Index post_sucsI;
  Index joI;
  ulong uVar21;
  long lVar22;
  size_t i;
  ulong uVar23;
  double p1;
  double dVar24;
  double extraout_XMM0_Qa;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  TransitionModelMappingSparse *local_1f8;
  ulong local_1f0;
  double local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_X;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  Scope post_Y_Sc;
  Scope sfScope;
  Scope AScope;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_factor_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_factor_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> O;
  Scope XScope;
  Scope YScope;
  vector<unsigned_long,_std::allocator<unsigned_long>_> output_factor_sizes;
  
  uVar21 = (ulong)sf;
  pSVar2 = (this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pSVar2[uVar21].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl !=
      pSVar2[uVar21].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_02 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_02,"Cannot marginalize a state factor with NS dependencies. NYI.");
    __cxa_throw(this_02,&E::typeinfo,E::~E);
  }
  this_00 = &this->_m_2dbn;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Marginalizing State Factor ",0x1b);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = 1;
  for (uVar23 = 0;
      uVar12 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this),
      uVar23 < uVar12; uVar23 = uVar23 + 1) {
    if (uVar21 != uVar23) {
      puVar13 = (pointer)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                                   (this,uVar23 & 0xffffffff);
      input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar13;
      if (new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&new_factor_sizes,
                   (iterator)
                   new_factor_sizes.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&input_factor_sizes);
      }
      else {
        *new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)puVar13;
        new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_1f0 = local_1f0 * (long)puVar13;
    }
  }
  pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&input_factor_sizes,pvVar14);
  input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar21] = 1;
  pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&output_factor_sizes,pvVar14);
  pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x100))(this);
  if (this->_m_cached_FlatTM == false) {
    MADPComponentDiscreteActions::ConstructJointActions(&this->_m_A);
  }
  if (this->_m_cached_FlatOM == false) {
    MADPComponentDiscreteObservations::ConstructJointObservations(&this->_m_O);
  }
  this->_m_sparse_FlatTM = sparse;
  this->_m_sparse_FlatOM = sparse;
  nrS = (int)local_1f0;
  if (this->_m_eventObservability == true) {
    if (sparse) {
      local_1f8 = (TransitionModelMappingSparse *)operator_new(0x28);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMappingSparse::TransitionModelMappingSparse(local_1f8,nrS,iVar6);
    }
    else {
      local_1f8 = (TransitionModelMappingSparse *)operator_new(0x28);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMapping::TransitionModelMapping((TransitionModelMapping *)local_1f8,nrS,iVar6);
    }
    if (this->_m_sparse_FlatOM == true) {
      this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      iVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
      EventObservationModelMappingSparse::EventObservationModelMappingSparse
                ((EventObservationModelMappingSparse *)this_01,nrS,iVar6,iVar7);
    }
    else {
      this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      iVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
      EventObservationModelMapping::EventObservationModelMapping
                ((EventObservationModelMapping *)this_01,nrS,iVar6,iVar7);
    }
  }
  else {
    if (sparse) {
      local_1f8 = (TransitionModelMappingSparse *)operator_new(0x28);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMappingSparse::TransitionModelMappingSparse(local_1f8,nrS,iVar6);
    }
    else {
      local_1f8 = (TransitionModelMappingSparse *)operator_new(0x28);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      TransitionModelMapping::TransitionModelMapping((TransitionModelMapping *)local_1f8,nrS,iVar6);
    }
    if (this->_m_sparse_FlatOM == true) {
      this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      iVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
      ObservationModelMappingSparse::ObservationModelMappingSparse(this_01,nrS,iVar6,iVar7);
    }
    else {
      this_01 = (ObservationModelMappingSparse *)operator_new(0x30);
      iVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
      iVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
      ObservationModelMapping::ObservationModelMapping
                ((ObservationModelMapping *)this_01,nrS,iVar6,iVar7);
    }
  }
  pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb0))(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&XScope.super_SDT,pvVar15);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&YScope.super_SDT,&XScope.super_SDT);
  AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar23 = 0;
  while( true ) {
    uVar12 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar12 <= uVar23) break;
    sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(sfScope.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,(uint)uVar23);
    if (AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&AScope,
                 (iterator)
                 AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&sfScope);
    }
    else {
      *AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = (uint)uVar23;
      AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar23 = uVar23 + 1;
  }
  sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = sf;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&sfScope,(iterator)0x0,(uint *)&X)
  ;
  sVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
  A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&X,sVar16,(value_type_conflict1 *)&A,(allocator_type *)&Y);
  sVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
  Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&A,sVar16,(value_type_conflict1 *)&Y,(allocator_type *)&post_X);
  sVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
  post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&Y,sVar16,(value_type_conflict1 *)&post_X,(allocator_type *)&post_Y);
  do {
    uVar8 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x138))(this,&A);
    post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pointer)CONCAT44(Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_)) {
      lVar22 = 0;
      uVar23 = 0;
      do {
        if (uVar21 != uVar23) {
          puVar20 = (uint *)(CONCAT44(X.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (Index)X.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) + lVar22);
          if (post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&post_X,
                       (iterator)
                       post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,puVar20);
          }
          else {
            *post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar20;
            post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar20 = (uint *)(CONCAT44(Y.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      Y.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar22);
          if (post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&post_Y,
                       (iterator)
                       post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,puVar20);
          }
          else {
            *post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar20;
            post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (uint)uVar23;
          if (post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&post_Y_Sc,
                       (iterator)
                       post_Y_Sc.super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(uint *)&O);
          }
          else {
            *post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish =
                 (uint)O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar23 = uVar23 + 1;
        lVar22 = lVar22 + 4;
      } while (uVar23 < (ulong)((long)Y.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                CONCAT44(Y.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         Y.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 2));
    }
    IVar9 = IndexTools::IndividualToJointIndices(&post_X,&new_factor_sizes);
    uVar23 = (ulong)IVar9;
    IVar10 = IndexTools::IndividualToJointIndices(&post_Y,&new_factor_sizes);
    p1 = TwoStageDynamicBayesianNetwork::GetYProbability(this_00,&X,&A,&Y);
    dVar24 = p1;
    bVar4 = Globals::EqualProbability(p1,0.0);
    if ((!bVar4) &&
       ((*(local_1f8->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.
          super_TransitionModel._vptr_TransitionModel[4])
                  (local_1f8,uVar23,(ulong)uVar8,(ulong)IVar10), 1e-12 < dVar24 + p1)) {
      (*(local_1f8->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.
        super_TransitionModel._vptr_TransitionModel[5])
                (local_1f8,(ulong)IVar9,(ulong)uVar8,(ulong)IVar10);
    }
    dVar24 = TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
                       (this_00,&XScope,&X,&AScope,&A,&YScope,&Y,&post_Y_Sc,&post_Y);
    uVar12 = 0;
    while( true ) {
      uVar17 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
      if (uVar17 <= uVar12) break;
      pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 400))(this,uVar12);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&O,pvVar15);
      auVar25._0_8_ = TwoStageDynamicBayesianNetwork::GetOProbability(this_00,&X,&A,&Y,&O);
      auVar25._8_8_ = 0;
      auVar26 = auVar25;
      bVar4 = Globals::EqualProbability(auVar25._0_8_,0.0);
      if (!bVar4) {
        (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
          super_ObservationModel._vptr_ObservationModel[5])
                  (this_01,uVar23,(ulong)uVar8,(ulong)IVar10,uVar12);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = p1;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar25._0_8_ * dVar24;
        auVar26 = vfmadd132sd_fma(auVar27,auVar26,auVar1);
        if (1e-12 < auVar26._0_8_) {
          (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
            super_ObservationModel._vptr_ObservationModel[7])
                    (this_01,uVar23,(ulong)uVar8,(ulong)IVar10,uVar12);
        }
      }
      pvVar3 = (void *)CONCAT44(O.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)O.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)O.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    if (post_Y_Sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(post_Y_Sc.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)post_Y_Sc.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)post_Y_Sc.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)post_Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    bVar4 = IndexTools::Increment(&Y,&output_factor_sizes);
  } while (((!bVar4) || (bVar4 = IndexTools::Increment(&A,pvVar14), !bVar4)) ||
          (bVar4 = IndexTools::Increment(&X,&input_factor_sizes), !bVar4));
  sVar16 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
  post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)post_X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&A,sVar16,(value_type_conflict1 *)&post_X);
  if (local_1f0 != 0) {
    uVar21 = 0;
    do {
      uVar23 = 0;
      while( true ) {
        uVar12 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))(this);
        if (uVar12 <= uVar23) break;
        uVar12 = 0;
        do {
          local_1e0 = 0.0;
          uVar17 = 0;
          while( true ) {
            uVar18 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
            if (uVar18 <= uVar17) break;
            dVar24 = extraout_XMM0_Qa;
            (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
              super_ObservationModel._vptr_ObservationModel[5])(this_01,uVar21,uVar23,uVar12,uVar17)
            ;
            local_1e0 = local_1e0 + dVar24;
            uVar17 = (ulong)((int)uVar17 + 1);
          }
          uVar17 = 0;
          while( true ) {
            uVar18 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
            if (uVar18 <= uVar17) break;
            if (local_1e0 <= 0.0) {
              uVar19 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x170))(this);
              auVar26 = vcvtusi2sd_avx512f(in_XMM2,uVar19);
              (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel[7])
                        (1.0 / auVar26._0_8_,this_01,uVar21,uVar23,uVar12,uVar17);
            }
            else {
              dVar24 = local_1e0;
              (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                super_ObservationModel._vptr_ObservationModel[5])
                        (this_01,uVar21,uVar23,uVar12,uVar17);
              if (1e-12 < dVar24) {
                (*(this_01->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
                  super_ObservationModel._vptr_ObservationModel[7])
                          (dVar24 / local_1e0,this_01,uVar21,uVar23,uVar12,uVar17);
              }
            }
            uVar17 = (ulong)((int)uVar17 + 1);
          }
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (uVar12 < local_1f0);
        uVar23 = (ulong)((int)uVar23 + 1);
      }
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (uVar21 < local_1f0);
  }
  if ((this->_m_cached_FlatTM != false) && (this->_m_p_tModel != (TransitionModelDiscrete *)0x0)) {
    (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
      _vptr_TransitionModel[1])();
  }
  if ((this->_m_cached_FlatOM == true) && (this->_m_p_oModel != (ObservationModelDiscrete *)0x0)) {
    (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
      _vptr_ObservationModel[1])();
  }
  this->_m_p_tModel = &local_1f8->super_TransitionModelDiscrete;
  this->_m_p_oModel = &this_01->super_ObservationModelDiscrete;
  this->_m_cached_FlatTM = true;
  this->_m_cached_FlatOM = true;
  RemoveStateFactor(this,sf);
  cVar5 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x60))(this);
  if (cVar5 != '\0') {
    (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x68))(this);
  }
  pvVar3 = (void *)CONCAT44(Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  pvVar3 = (void *)CONCAT44(A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  pvVar3 = (void *)CONCAT44(X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (Index)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (sfScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sfScope.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)sfScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sfScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(AScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)AScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)AScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (YScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(YScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)YScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)YScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (XScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(XScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)XScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)XScope.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (output_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(output_factor_sizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)output_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)output_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (input_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(input_factor_sizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)input_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)input_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (new_factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(new_factor_sizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)new_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)new_factor_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel(const Index sf, bool sparse)
{
    const Scope& YSoI_sf = _m_2dbn.GetYSoI_Y(sf);
  
    if(!YSoI_sf.empty()){
      throw E("Cannot marginalize a state factor with NS dependencies. NYI.");
    }

    cout << "Marginalizing State Factor " << sf << endl;

    size_t nrS = 1;
    vector<size_t> new_factor_sizes;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
        if(i == sf)
            continue;
        size_t nrX = GetNrValuesForFactor(i);
        nrS *= nrX;
        new_factor_sizes.push_back(nrX);
    }
    vector<size_t> input_factor_sizes = GetNrValuesPerFactor();
    input_factor_sizes[sf] = 1;
    vector<size_t> output_factor_sizes = GetNrValuesPerFactor();
    const vector<size_t>& actions = GetNrActions();

    if(!_m_cached_FlatTM)
        ConstructJointActions();
    if(!_m_cached_FlatOM)
        ConstructJointObservations();
    
    TransitionModelDiscrete* marginalized_tm;
    ObservationModelDiscrete* marginalized_om;

    _m_sparse_FlatTM = sparse;
    _m_sparse_FlatOM = sparse;

    if(_m_eventObservability)
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                EventObservationModelMappingSparse(nrS,
                                                   GetNrJointActions(), 
                                                   GetNrJointObservations());
        else
            marginalized_om = new 
                EventObservationModelMapping(nrS,
                                             GetNrJointActions(), 
                                             GetNrJointObservations());
    }
    else
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());      
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                ObservationModelMappingSparse(nrS,
                                              GetNrJointActions(), 
                                              GetNrJointObservations());
        else
            marginalized_om = new 
                ObservationModelMapping(nrS,
                                        GetNrJointActions(), 
                                        GetNrJointObservations());
    }

    Scope XScope = GetAllStateFactorScope();
    Scope YScope(XScope);
    Scope AScope;
    for(size_t i = 0; i < GetNrAgents(); i++)
        AScope.Insert(i);
    Scope sfScope;
    sfScope.Insert(sf);

    vector<Index> X(GetNrStateFactors(),0);
    vector<Index> A(GetNrAgents(),0);
    vector<Index> Y(GetNrStateFactors(),0);
    do{
        do{
            do{
                Index jaI = IndividualToJointActionIndices(A);
                vector<Index> post_X;
                vector<Index> post_Y;
                Scope post_Y_Sc;
                for(size_t i = 0; i < Y.size(); i++)
                    if(i != sf){
                        post_X.push_back(X[i]);
                        post_Y.push_back(Y[i]);
                        post_Y_Sc.Insert(i);
                    }

                Index post_sI = IndexTools::IndividualToJointIndices(post_X, new_factor_sizes);
                Index post_sucsI = IndexTools::IndividualToJointIndices(post_Y, new_factor_sizes);
        
                double p_t = _m_2dbn.GetYProbability(X,A,Y);
                if(! Globals::EqualProbability(p_t, 0) )
                {
                    double post_p_t = marginalized_tm->Get(post_sI, jaI, post_sucsI);
                    double p_t_sum = post_p_t+p_t;
                    if(p_t_sum > Globals::PROB_PRECISION)
                        marginalized_tm->Set(post_sI, jaI, post_sucsI, p_t_sum); //marginalization
                }
                double post_p_given_sf = _m_2dbn.GetYProbabilityGeneral(XScope,
                                                                        X,
                                                                        AScope,
                                                                        A,
                                                                        YScope,
                                                                        Y,
                                                                        post_Y_Sc,
                                                                        post_Y);

                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    vector<Index> O = JointToIndividualObservationIndices(joI);
    
                    double p_o = _m_2dbn.GetOProbability(X,A,Y,O);
                    if(! Globals::EqualProbability(p_o, 0) )
                    {
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        double p_o_sum = post_p_o + p_o*post_p_given_sf*p_t;
                        if(p_o_sum > Globals::PROB_PRECISION)
                            marginalized_om->Set(post_sI, jaI, post_sucsI, joI, p_o_sum); //marginalization
                    }
                }
            }while(!IndexTools::Increment( Y, output_factor_sizes ));
        }while(!IndexTools::Increment( A, actions ));
    }while(!IndexTools::Increment( X, input_factor_sizes ));

    A.assign(GetNrAgents(),0);
    //now we need to sanitize the observation model.
    for(Index post_sI = 0; post_sI < nrS; post_sI++){
        for(Index jaI = 0; jaI < GetNrJointActions(); jaI++){
            for(Index post_sucsI = 0; post_sucsI < nrS; post_sucsI++){
                double p_total = 0;
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    p_total += marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                }
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    if(p_total > 0){
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        if(post_p_o > Globals::PROB_PRECISION)
                          marginalized_om->Set(post_sI, jaI, post_sucsI, joI, post_p_o/p_total); //normalization
                    }
                    else
                        marginalized_om->Set(post_sI, jaI, post_sucsI, joI, 1.0/GetNrJointObservations()); //impossible transition
                }
            }
        }
    }
    
    if(_m_cached_FlatTM)
        delete(_m_p_tModel);
    if(_m_cached_FlatOM)
        delete(_m_p_oModel);

    _m_p_tModel = marginalized_tm;
    _m_p_oModel = marginalized_om;

    _m_cached_FlatTM = true;
    _m_cached_FlatOM = true;  

    RemoveStateFactor(sf);

    SanityCheck();
}